

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O3

void set_early_term_based_on_uv_plane
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MACROBLOCKD *xd,int mi_row,int mi_col,
               int *early_term,int num_blk,uint *sse_tx,uint *var_tx,int sum,uint var,uint sse)

{
  BLOCK_SIZE BVar1;
  short *psVar2;
  int iVar3;
  uint uVar4;
  sbyte sVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  buf_2d *pbVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  int skip_uv [2];
  uint sse_uv [2];
  
  psVar2 = x->plane[0].dequant_QTX;
  iVar3 = (int)*psVar2;
  iVar9 = (int)psVar2[1];
  uVar6 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  uVar4 = -sum;
  if (0 < sum) {
    uVar4 = sum;
  }
  sVar5 = ((cpi->common).height < 0x1e1 && (cpi->common).width < 0x281) + 1;
  if (4 < uVar4 >> (""[uVar6] + ""[uVar6] & 0x1f)) {
    sVar5 = 0;
  }
  if ((cpi->oxcf).speed < 8) {
    sVar5 = 0;
  }
  uVar10 = (ulong)(((uint)(iVar9 * iVar9) >> 6) << sVar5);
  bVar16 = (cpi->sf).rt_sf.increase_source_sad_thresh != 0;
  uVar11 = uVar10 * 4;
  if (!bVar16) {
    uVar11 = uVar10;
  }
  if (0 < num_blk) {
    uVar10 = 0;
    do {
      if ((var != 0) && (uVar11 <= var_tx[uVar10])) {
        return;
      }
      if ((sse != var) &&
         (((uint)(iVar3 * iVar3) >> 6) << bVar16 <= sse_tx[uVar10] - var_tx[uVar10])) {
        return;
      }
      uVar10 = uVar10 + 1;
    } while ((uint)num_blk != uVar10);
  }
  skip_uv[0] = 0;
  skip_uv[1] = 0;
  piVar12 = &xd->plane[1].subsampling_x;
  pbVar13 = &x->plane[1].src;
  lVar14 = 0;
  lVar7 = 0;
  do {
    skip_uv[lVar7] = 1;
    if (x->color_sensitivity[lVar7] != '\0') {
      skip_uv[lVar7] = 0;
      BVar1 = av1_ss_size_lookup[uVar6][*piVar12][piVar12[1]];
      iVar3 = (cpi->sf).rt_sf.increase_source_sad_thresh;
      iVar8 = (int)**(int16_t **)((long)(pbVar13 + 2) + 0x10);
      iVar15 = (int)(*(int16_t **)((long)(pbVar13 + 2) + 0x10))[1];
      iVar9 = (int)lVar7 + 1;
      av1_enc_build_inter_predictor
                (&cpi->common,xd,mi_row,mi_col,(BUFFER_SET *)0x0,bsize,iVar9,iVar9);
      uVar4 = (*cpi->ppi->fn_ptr[BVar1].vf)
                        (pbVar13->buf,pbVar13->stride,((buf_2d *)(piVar12 + 3))->buf,piVar12[9],
                         (uint *)((long)sse_uv + lVar14));
      if ((uint)(iVar15 * iVar15) >> (iVar3 != 0) * '\x02' + 3 <= uVar4 && uVar4 != 0) break;
      if ((sse_uv[lVar7] != uVar4) &&
         ((uint)(iVar8 * iVar8) >> (4U - (iVar3 == 0) & 0x1f) <= sse_uv[lVar7] - uVar4)) break;
      skip_uv[lVar7] = 1;
    }
    piVar12 = piVar12 + 0x28c;
    pbVar13 = (buf_2d *)((long)(pbVar13 + 4) + 8);
    lVar7 = lVar7 + 1;
    lVar14 = lVar14 + 4;
  } while (lVar7 != 2);
  if ((skip_uv[0] & skip_uv[1]) != 0) {
    *early_term = 1;
  }
  return;
}

Assistant:

static inline void set_early_term_based_on_uv_plane(
    AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize, MACROBLOCKD *xd, int mi_row,
    int mi_col, int *early_term, int num_blk, const unsigned int *sse_tx,
    const unsigned int *var_tx, int sum, unsigned int var, unsigned int sse) {
  AV1_COMMON *const cm = &cpi->common;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  const uint32_t dc_quant = p->dequant_QTX[0];
  const uint32_t ac_quant = p->dequant_QTX[1];
  int64_t dc_thr = dc_quant * dc_quant >> 6;
  int64_t ac_thr = ac_quant * ac_quant >> 6;
  const int bw = b_width_log2_lookup[bsize];
  const int bh = b_height_log2_lookup[bsize];
  int ac_test = 1;
  int dc_test = 1;
  const int norm_sum = abs(sum) >> (bw + bh);

#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && denoise_svc(cpi) &&
      cpi->oxcf.speed > 5)
    ac_thr = av1_scale_acskip_thresh(ac_thr, cpi->denoiser.denoising_level,
                                     norm_sum, cpi->svc.temporal_layer_id);
  else
    ac_thr *= ac_thr_factor(cpi->oxcf.speed, cm->width, cm->height, norm_sum);
#else
  ac_thr *= ac_thr_factor(cpi->oxcf.speed, cm->width, cm->height, norm_sum);

#endif

  if (cpi->sf.rt_sf.increase_source_sad_thresh) {
    dc_thr = dc_thr << 1;
    ac_thr = ac_thr << 2;
  }

  for (int k = 0; k < num_blk; k++) {
    // Check if all ac coefficients can be quantized to zero.
    if (!(var_tx[k] < ac_thr || var == 0)) {
      ac_test = 0;
      break;
    }
    // Check if dc coefficient can be quantized to zero.
    if (!(sse_tx[k] - var_tx[k] < dc_thr || sse == var)) {
      dc_test = 0;
      break;
    }
  }

  // Check if chroma can be skipped based on ac and dc test flags.
  if (ac_test && dc_test) {
    int skip_uv[2] = { 0 };
    unsigned int var_uv[2];
    unsigned int sse_uv[2];
    // Transform skipping test in UV planes.
    for (int plane = AOM_PLANE_U; plane <= AOM_PLANE_V; plane++) {
      int j = plane - 1;
      skip_uv[j] = 1;
      if (x->color_sensitivity[COLOR_SENS_IDX(plane)]) {
        skip_uv[j] = 0;
        struct macroblock_plane *const puv = &x->plane[plane];
        struct macroblockd_plane *const puvd = &xd->plane[plane];
        const BLOCK_SIZE uv_bsize = get_plane_block_size(
            bsize, puvd->subsampling_x, puvd->subsampling_y);
        // Adjust these thresholds for UV.
        const int shift_ac = cpi->sf.rt_sf.increase_source_sad_thresh ? 5 : 3;
        const int shift_dc = cpi->sf.rt_sf.increase_source_sad_thresh ? 4 : 3;
        const int64_t uv_dc_thr =
            (puv->dequant_QTX[0] * puv->dequant_QTX[0]) >> shift_dc;
        const int64_t uv_ac_thr =
            (puv->dequant_QTX[1] * puv->dequant_QTX[1]) >> shift_ac;
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                      plane, plane);
        var_uv[j] = cpi->ppi->fn_ptr[uv_bsize].vf(puv->src.buf, puv->src.stride,
                                                  puvd->dst.buf,
                                                  puvd->dst.stride, &sse_uv[j]);
        if ((var_uv[j] < uv_ac_thr || var_uv[j] == 0) &&
            (sse_uv[j] - var_uv[j] < uv_dc_thr || sse_uv[j] == var_uv[j]))
          skip_uv[j] = 1;
        else
          break;
      }
    }
    if (skip_uv[0] & skip_uv[1]) {
      *early_term = 1;
    }
  }
}